

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

char * crn_get_dxt_quality_string(crn_dxt_quality q)

{
  crn_dxt_quality q_local;
  char *local_8;
  
  switch(q) {
  case cCRNDXTQualitySuperFast:
    local_8 = "SuperFast";
    break;
  case cCRNDXTQualityFast:
    local_8 = "Fast";
    break;
  case cCRNDXTQualityNormal:
    local_8 = "Normal";
    break;
  case cCRNDXTQualityBetter:
    local_8 = "Better";
    break;
  case cCRNDXTQualityUber:
    local_8 = "Uber";
    break;
  default:
    local_8 = "?";
  }
  return local_8;
}

Assistant:

const char* crn_get_dxt_quality_string(crn_dxt_quality q) {
  switch (q) {
    case cCRNDXTQualitySuperFast:
      return "SuperFast";
    case cCRNDXTQualityFast:
      return "Fast";
    case cCRNDXTQualityNormal:
      return "Normal";
    case cCRNDXTQualityBetter:
      return "Better";
    case cCRNDXTQualityUber:
      return "Uber";
    default:
      break;
  }
  CRNLIB_ASSERT(false);
  return "?";
}